

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

void do_sarray_io(j_common_ptr cinfo,jvirt_sarray_ptr ptr,boolean writing)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar4 = (ulong)ptr->rows_in_mem;
  if (uVar4 != 0) {
    uVar1 = ptr->samplesperrow;
    uVar6 = (ulong)ptr->rowsperchunk;
    lVar7 = (ulong)ptr->cur_start_row * (ulong)uVar1;
    uVar5 = 0;
    do {
      uVar2 = uVar4 - uVar5;
      if ((long)uVar6 <= (long)(uVar4 - uVar5)) {
        uVar2 = uVar6;
      }
      lVar3 = ptr->cur_start_row + uVar5;
      uVar4 = (ulong)ptr->first_undef_row - lVar3;
      if ((long)uVar2 < (long)uVar4) {
        uVar4 = uVar2;
      }
      uVar6 = (ulong)ptr->rows_in_array - lVar3;
      if ((long)uVar4 < (long)uVar6) {
        uVar6 = uVar4;
      }
      if ((long)uVar6 < 1) {
        return;
      }
      lVar3 = uVar6 * uVar1;
      (*(&(ptr->b_s_info).read_backing_store)[writing != 0])
                (cinfo,&ptr->b_s_info,ptr->mem_buffer[uVar5],lVar7,lVar3);
      lVar7 = lVar7 + lVar3;
      uVar4 = (ulong)ptr->rows_in_mem;
      uVar6 = (ulong)ptr->rowsperchunk;
      uVar5 = uVar5 + uVar6;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

LOCAL(void)
do_sarray_io (j_common_ptr cinfo, jvirt_sarray_ptr ptr, boolean writing)
/* Do backing store read or write of a virtual sample array */
{
  long bytesperrow, file_offset, byte_count, rows, thisrow, i;

  bytesperrow = (long) ptr->samplesperrow * SIZEOF(JSAMPLE);
  file_offset = ptr->cur_start_row * bytesperrow;
  /* Loop to read or write each allocation chunk in mem_buffer */
  for (i = 0; i < (long) ptr->rows_in_mem; i += ptr->rowsperchunk) {
    /* One chunk, but check for short chunk at end of buffer */
    rows = MIN((long) ptr->rowsperchunk, (long) ptr->rows_in_mem - i);
    /* Transfer no more than is currently defined */
    thisrow = (long) ptr->cur_start_row + i;
    rows = MIN(rows, (long) ptr->first_undef_row - thisrow);
    /* Transfer no more than fits in file */
    rows = MIN(rows, (long) ptr->rows_in_array - thisrow);
    if (rows <= 0)		/* this chunk might be past end of file! */
      break;
    byte_count = rows * bytesperrow;
    if (writing)
      (*ptr->b_s_info.write_backing_store) (cinfo, & ptr->b_s_info,
					    (void FAR *) ptr->mem_buffer[i],
					    file_offset, byte_count);
    else
      (*ptr->b_s_info.read_backing_store) (cinfo, & ptr->b_s_info,
					   (void FAR *) ptr->mem_buffer[i],
					   file_offset, byte_count);
    file_offset += byte_count;
  }
}